

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_gainer_get_heap_size(ma_gainer_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  undefined8 *in_RSI;
  ma_gainer_heap_layout heapLayout;
  ma_result result;
  ma_gainer_config *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    mVar1 = ma_gainer_get_heap_layout(in_stack_ffffffffffffffc8,(ma_gainer_heap_layout *)0x1c8739);
    if (mVar1 == MA_SUCCESS) {
      *in_RSI = in_stack_ffffffffffffffc8;
      local_4 = MA_SUCCESS;
    }
    else {
      local_4 = MA_INVALID_ARGS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_gainer_get_heap_size(const ma_gainer_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_gainer_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_gainer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}